

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

CURLUcode parseurl(char *url,CURLU *u,uint flags)

{
  char *pcVar1;
  byte bVar2;
  _Bool _Var3;
  int iVar4;
  uint uVar5;
  CURLUcode CVar6;
  size_t sVar7;
  byte *pbVar8;
  byte *pbVar9;
  char *pcVar10;
  Curl_handler *pCVar11;
  byte *pbVar12;
  byte *pbVar13;
  char *pcVar14;
  bool bVar15;
  char *hostname;
  char schemebuf [8];
  CURLUcode local_5c;
  char *local_58;
  byte *local_50;
  char local_48 [8];
  char *local_40;
  byte *local_38;
  
  sVar7 = strlen(url);
  pbVar8 = (byte *)(*Curl_cmalloc)(sVar7 * 2 + 2);
  u->scratch = (char *)pbVar8;
  if (pbVar8 == (byte *)0x0) {
LAB_00497e81:
    local_5c = CURLUE_OUT_OF_MEMORY;
  }
  else {
    pbVar9 = pbVar8 + sVar7 + 1;
    pbVar8[sVar7 + 1] = 0;
    local_50 = pbVar9;
    _Var3 = Curl_is_absolute_url(url,local_48,8);
    if (_Var3) {
      sVar7 = strlen(local_48);
      pcVar10 = local_48;
      iVar4 = Curl_strcasecompare(pcVar10,"file");
      if (iVar4 == 0) {
        *pbVar8 = 0;
        if (!_Var3) goto LAB_00497932;
        pcVar14 = url + sVar7 + 1;
        bVar15 = true;
        pcVar1 = url + sVar7 + 1;
        url = pcVar14;
        if (*pcVar1 == '/') {
          uVar5 = 0xffffffff;
          do {
            uVar5 = uVar5 + 1;
            pcVar1 = pcVar14 + 1;
            pcVar14 = pcVar14 + 1;
            if (*pcVar1 != '/') break;
          } while (uVar5 < 3);
          bVar15 = 2 < uVar5;
          url = pcVar14;
        }
        local_5c = CURLUE_MALFORMED_INPUT;
        if (bVar15) {
          pcVar10 = (char *)0x0;
LAB_00497a95:
          bVar15 = false;
        }
        else {
          pCVar11 = Curl_builtin_scheme(pcVar10);
          if ((flags & 8) == 0 && pCVar11 == (Curl_handler *)0x0) {
            local_5c = CURLUE_UNSUPPORTED_SCHEME;
            goto LAB_00497a95;
          }
          pcVar10 = local_48;
          CVar6 = junkscan(pcVar10);
          bVar15 = CVar6 == CURLUE_OK;
        }
        if (!bVar15) goto LAB_004979f1;
        goto LAB_00497953;
      }
      strcpy((char *)pbVar8,url + 5);
      local_50 = (byte *)0x0;
      pcVar10 = (*Curl_cstrdup)("file");
      u->scheme = pcVar10;
      if (pcVar10 == (char *)0x0) goto LAB_00497e81;
      pbVar9 = pbVar8;
      if ((*pbVar8 == 0x2f) && (pbVar8[1] == 0x2f)) {
        pbVar9 = pbVar8 + 2;
        bVar15 = true;
        if ((pbVar8[2] != 0x2f) &&
           (((0x19 < (byte)((pbVar8[2] & 0xdf) + 0xbf) ||
             ((pbVar8[3] != 0x7c && (pbVar8[3] != 0x3a)))) ||
            ((bVar2 = pbVar8[4], bVar2 != 0 && ((bVar2 != 0x2f && (bVar2 != 0x5c)))))))) {
          iVar4 = curl_strnequal("localhost/",(char *)pbVar9,10);
          if ((iVar4 == 0) && (iVar4 = curl_strnequal("127.0.0.1/",(char *)pbVar9,10), iVar4 == 0))
          {
            bVar15 = false;
            pbVar9 = pbVar8;
          }
          else {
            pbVar9 = pbVar8 + 0xb;
          }
        }
        local_5c = CURLUE_MALFORMED_INPUT;
        if (!bVar15) goto LAB_00497e86;
      }
      if (((*pbVar9 == 0x2f) && ((byte)((pbVar9[1] & 0xdf) + 0xbf) < 0x1a)) &&
         ((pbVar9[2] == 0x7c || (pbVar9[2] == 0x3a)))) {
        bVar2 = pbVar9[3];
        local_5c = CURLUE_MALFORMED_INPUT;
        if (((bVar2 == 0) || (bVar2 == 0x2f)) || (bVar2 == 0x5c)) goto LAB_00497e86;
      }
      local_5c = CURLUE_MALFORMED_INPUT;
      pbVar8 = pbVar9;
      if ((((byte)((*pbVar9 & 0xdf) + 0xbf) < 0x1a) && ((pbVar9[1] == 0x7c || (pbVar9[1] == 0x3a))))
         && ((bVar2 = pbVar9[2], bVar2 == 0 || ((bVar2 == 0x2f || (bVar2 == 0x5c))))))
      goto LAB_00497e86;
    }
    else {
      *pbVar8 = 0;
LAB_00497932:
      if ((flags & 0x204) == 0) {
        local_5c = CURLUE_MALFORMED_INPUT;
LAB_004979f1:
        bVar15 = false;
      }
      else {
        pcVar10 = (char *)0x0;
        if ((flags & 4) != 0) {
          pcVar10 = "https";
        }
LAB_00497953:
        sVar7 = 0;
        while ((0x3f < (ulong)(byte)url[sVar7] ||
               ((0x8000800800000001U >> ((ulong)(byte)url[sVar7] & 0x3f) & 1) == 0))) {
          sVar7 = sVar7 + 1;
        }
        if (sVar7 == 0) {
          bVar15 = false;
          local_5c = CURLUE_MALFORMED_INPUT;
        }
        else {
          local_40 = url + sVar7;
          local_38 = pbVar8;
          memcpy(pbVar9,url,sVar7);
          pbVar8 = local_38;
          pbVar9[sVar7] = 0;
          if (pcVar10 == (char *)0x0 && (flags >> 9 & 1) != 0) {
            iVar4 = curl_strnequal("ftp.",(char *)pbVar9,4);
            if (iVar4 == 0) {
              iVar4 = curl_strnequal("dict.",(char *)pbVar9,5);
              if (iVar4 == 0) {
                iVar4 = curl_strnequal("ldap.",(char *)pbVar9,5);
                if (iVar4 == 0) {
                  iVar4 = curl_strnequal("imap.",(char *)pbVar9,5);
                  if (iVar4 == 0) {
                    iVar4 = curl_strnequal("smtp.",(char *)pbVar9,5);
                    if (iVar4 == 0) {
                      iVar4 = curl_strnequal("pop3.",(char *)pbVar9,5);
                      pcVar10 = "pop3";
                      if (iVar4 == 0) {
                        pcVar10 = "http";
                      }
                    }
                    else {
                      pcVar10 = "smtp";
                    }
                  }
                  else {
                    pcVar10 = "imap";
                  }
                }
                else {
                  pcVar10 = "ldap";
                }
              }
              else {
                pcVar10 = "dict";
              }
            }
            else {
              pcVar10 = "ftp";
            }
          }
          pcVar14 = local_40;
          sVar7 = strlen(local_40);
          memcpy(pbVar8,pcVar14,sVar7);
          pbVar8[sVar7] = 0;
          pcVar10 = (*Curl_cstrdup)(pcVar10);
          u->scheme = pcVar10;
          bVar15 = pcVar10 != (char *)0x0;
          if (!bVar15) {
            local_5c = CURLUE_OUT_OF_MEMORY;
          }
        }
      }
      if (!bVar15) goto LAB_00497e86;
    }
    pCVar11 = Curl_builtin_scheme(u->scheme);
    CVar6 = junkscan((char *)pbVar8);
    if (CVar6 != CURLUE_OK) {
      local_5c = CURLUE_MALFORMED_INPUT;
      goto LAB_00497e86;
    }
    pcVar10 = strchr((char *)pbVar8,0x3f);
    if (pcVar10 == (char *)0x0) {
      pbVar9 = (byte *)0x0;
    }
    else {
      pbVar9 = (byte *)(pcVar10 + 1);
      *pcVar10 = '\0';
    }
    pbVar12 = pbVar9;
    if (pbVar9 == (byte *)0x0) {
      pbVar12 = pbVar8;
    }
    pcVar10 = strchr((char *)pbVar12,0x23);
    if (pcVar10 == (char *)0x0) {
      local_58 = (char *)0x0;
    }
    else {
      local_58 = pcVar10 + 1;
      *pcVar10 = '\0';
    }
    if (*pbVar8 == 0) {
      bVar15 = false;
      pbVar8 = (byte *)0x0;
    }
    else if ((flags & 0x10) == 0) {
      pbVar12 = (byte *)Curl_dedotdotify((char *)pbVar8);
      if (pbVar12 == (byte *)0x0) {
        local_5c = CURLUE_OUT_OF_MEMORY;
LAB_00497d75:
        bVar15 = false;
        pbVar13 = pbVar8;
      }
      else {
        iVar4 = strcmp((char *)pbVar12,(char *)pbVar8);
        bVar15 = iVar4 != 0;
        pbVar13 = pbVar12;
        if (iVar4 == 0) {
          (*Curl_cfree)(pbVar12);
          goto LAB_00497d75;
        }
      }
      pbVar8 = pbVar13;
      if (pbVar12 == (byte *)0x0) goto LAB_00497e86;
    }
    else {
      bVar15 = false;
    }
    if (pbVar8 != (byte *)0x0) {
      if (!bVar15) {
        pbVar8 = (byte *)(*Curl_cstrdup)((char *)pbVar8);
      }
      u->path = (char *)pbVar8;
      if (pbVar8 == (byte *)0x0) goto LAB_00497e81;
    }
    if (local_50 != (byte *)0x0) {
      CVar6 = junkscan((char *)local_50);
      local_5c = CURLUE_MALFORMED_INPUT;
      if ((((CVar6 != CURLUE_OK) ||
           (local_5c = parse_hostname_login(u,pCVar11,(char **)&local_50,flags), pbVar8 = local_50,
           local_5c != CURLUE_OK)) ||
          (pbVar12 = local_50, local_5c = parse_port(u,(char *)local_50), local_5c != CURLUE_OK)) ||
         (local_5c = hostname_check((char *)pbVar8,(uint)pbVar12), local_5c != CURLUE_OK))
      goto LAB_00497e86;
      pcVar10 = (*Curl_cstrdup)((char *)pbVar8);
      u->host = pcVar10;
      if (pcVar10 == (char *)0x0) goto LAB_00497e81;
    }
    if ((pbVar9 != (byte *)0x0) && (*pbVar9 != 0)) {
      pcVar10 = (*Curl_cstrdup)((char *)pbVar9);
      u->query = pcVar10;
      if (pcVar10 == (char *)0x0) goto LAB_00497e81;
    }
    if ((local_58 != (char *)0x0) && (*local_58 != '\0')) {
      pcVar10 = (*Curl_cstrdup)(local_58);
      u->fragment = pcVar10;
      local_5c = CURLUE_OUT_OF_MEMORY;
      if (pcVar10 == (char *)0x0) goto LAB_00497e86;
    }
    (*Curl_cfree)(u->scratch);
    u->scratch = (char *)0x0;
    local_5c = CURLUE_OK;
  }
LAB_00497e86:
  if (local_5c != CURLUE_OK) {
    free_urlhandle(u);
    u->fragment = (char *)0x0;
    u->scratch = (char *)0x0;
    u->path = (char *)0x0;
    u->query = (char *)0x0;
    u->host = (char *)0x0;
    u->port = (char *)0x0;
    u->password = (char *)0x0;
    u->options = (char *)0x0;
    u->scheme = (char *)0x0;
    u->user = (char *)0x0;
    u->portnum = 0;
  }
  return local_5c;
}

Assistant:

static CURLUcode parseurl(const char *url, CURLU *u, unsigned int flags)
{
  CURLUcode result = seturl(url, u, flags);
  if(result) {
    free_urlhandle(u);
    memset(u, 0, sizeof(struct Curl_URL));
  }
  return result;
}